

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

JavascriptString * Js::JavascriptString::ToCaseCore<true,true>(JavascriptString *pThis)

{
  long lVar1;
  long lVar2;
  char16 cVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  int iVar7;
  charcount_t cchUseLength;
  charcount_t cVar8;
  ScriptContext *scriptContext;
  JavascriptString *pJVar9;
  ulong uVar10;
  JavascriptString *pJVar11;
  Recycler *pRVar12;
  undefined4 *puVar13;
  char16 *pcVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar15;
  char16 cVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  undefined1 local_78 [8];
  TrackAllocData data;
  ApiError local_34 [2];
  ApiError error;
  
  if (pThis->m_charLength == 0) {
    return pThis;
  }
  scriptContext = Js::Type::GetScriptContext((pThis->super_RecyclableObject).type.ptr);
  local_34[0] = NoError;
  uVar17 = pThis->m_charLength;
  uVar18 = (ulong)uVar17;
  pJVar9 = (JavascriptString *)GetString(pThis);
  bVar19 = uVar18 != 0;
  if (uVar18 == 0) {
LAB_00d2cf91:
    if (uVar17 == 0xffffffff) goto LAB_00d2d58b;
    local_78 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_80c6cf2;
    data.filename._0_4_ = 0x918;
    data.plusSize = (ulong)(uVar17 + 1);
    pRVar12 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
    if (uVar17 == 0xffffffff) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar12,(TrackAllocData *)0x0);
      pcVar14 = (char16 *)&DAT_00000008;
    }
    else {
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        data._32_8_ = __tls_get_addr(&PTR_0155fe48);
        *(undefined4 *)data._32_8_ = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_00d2d590;
        *(undefined4 *)data._32_8_ = 0;
      }
      pcVar14 = (char16 *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (pRVar12,(ulong)(uVar17 + 1) * 2);
      if (pcVar14 == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) goto LAB_00d2d590;
        *puVar13 = 0;
      }
    }
    if (uVar18 != 0) {
      uVar10 = 0;
      do {
        cVar3 = *(char16 *)
                 ((long)&(pJVar9->super_RecyclableObject).super_FinalizableObject.
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + uVar10 * 2);
        cVar16 = cVar3 + L'￠';
        if (0x19 < (ushort)(cVar3 + L'ﾟ')) {
          cVar16 = cVar3;
        }
        pcVar14[uVar10] = cVar16;
        uVar10 = uVar10 + 1;
      } while (uVar18 != uVar10);
    }
    pcVar14[uVar18] = L'\0';
    pJVar11 = NewWithBufferT<Js::LiteralString,false>(pcVar14,uVar17,scriptContext);
  }
  else {
    pJVar11 = pJVar9;
    if ((ushort)*(char16 *)
                 &(pJVar9->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject < 0x80) {
      pJVar11 = (JavascriptString *)(ulong)(uVar17 - 1);
      lVar15 = 0;
      do {
        if (uVar17 - 1 == (uint)lVar15) {
          bVar19 = false;
          goto LAB_00d2cf91;
        }
        lVar1 = lVar15 + 1;
        lVar2 = lVar15 * 2;
        lVar15 = lVar1;
      } while (*(ushort *)
                ((long)&(pJVar9->super_RecyclableObject).super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar2 + 2) <
               0x80);
      bVar19 = (uint)lVar1 < uVar17;
    }
  }
  if (!bVar19) {
    return pJVar11;
  }
  uVar17 = uVar17 + 1;
  if (uVar17 == 0) {
LAB_00d2d58b:
    ::Math::DefaultOverflowPolicy();
  }
  local_78 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_80c6cf2;
  data.filename._0_4_ = 0x948;
  data.plusSize = (ulong)uVar17;
  pRVar12 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
  if (uVar17 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar12,(TrackAllocData *)0x0);
    pcVar14 = (char16 *)&DAT_00000008;
  }
  else {
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar19 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                   ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                   "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar19) goto LAB_00d2d590;
      *puVar13 = 0;
    }
    pcVar14 = (char16 *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                        (pRVar12,(ulong)uVar17 * 2);
    if (pcVar14 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar19 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                   ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar19) goto LAB_00d2d590;
      *puVar13 = 0;
    }
  }
  iVar7 = (*(pThis->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pThis);
  cchUseLength = PlatformAgnostic::UnicodeText::ChangeStringLinguisticCase<true,true>
                           ((char16 *)CONCAT44(extraout_var,iVar7),pThis->m_charLength,pcVar14,
                            uVar17,local_34);
  if (local_34[0] == OutOfMemory) {
    Throw::OutOfMemory();
  }
  if (0x7ffffffd < cchUseLength - 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar19 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                 ,0x956,
                                 "(requiredStringLength > 0 && IsValidCharCount(requiredStringLength))"
                                 ,
                                 "requiredStringLength > 0 && IsValidCharCount(requiredStringLength)"
                                );
    if (!bVar19) goto LAB_00d2d590;
    *puVar13 = 0;
  }
  if (local_34[0] != InsufficientBuffer) {
    if (local_34[0] == NoError) {
      if (cchUseLength == 1) {
        pJVar9 = CharStringCache::GetStringForChar
                           (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                             charStringCache,*pcVar14);
        return pJVar9;
      }
      goto LAB_00d2d571;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar19 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                 ,0x966,"(error == ApiError::InsufficientBuffer)",
                                 "error == ApiError::InsufficientBuffer");
    if (!bVar19) goto LAB_00d2d590;
    *puVar13 = 0;
  }
  if (cchUseLength < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar19 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                 ,0x974,"(requiredStringLength > 1)","requiredStringLength > 1");
    if (!bVar19) goto LAB_00d2d590;
    *puVar13 = 0;
  }
  uVar17 = cchUseLength + 1;
  if (uVar17 == 0) goto LAB_00d2d58b;
  local_78 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_80c6cf2;
  data.filename._0_4_ = 0x977;
  data.plusSize = (ulong)uVar17;
  pRVar12 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
  if (uVar17 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar12,(TrackAllocData *)0x0);
    pcVar14 = (char16 *)&DAT_00000008;
  }
  else {
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar19 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                   ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                   "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar19) goto LAB_00d2d590;
      *puVar13 = 0;
    }
    pcVar14 = (char16 *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                        (pRVar12,(ulong)uVar17 * 2);
    if (pcVar14 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar19 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                   ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar19) goto LAB_00d2d590;
      *puVar13 = 0;
    }
  }
  iVar7 = (*(pThis->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pThis);
  cVar8 = PlatformAgnostic::UnicodeText::ChangeStringLinguisticCase<true,true>
                    ((char16 *)CONCAT44(extraout_var_00,iVar7),pThis->m_charLength,pcVar14,uVar17,
                     local_34);
  if ((cVar8 != cchUseLength) || (cchUseLength = cVar8, local_34[0] != NoError)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar19 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                 ,0x979,
                                 "(actualStringLength == requiredStringLength && error == ApiError::NoError)"
                                 ,
                                 "actualStringLength == requiredStringLength && error == ApiError::NoError"
                                );
    if (!bVar19) {
LAB_00d2d590:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar13 = 0;
    cchUseLength = cVar8;
  }
LAB_00d2d571:
  pJVar9 = NewWithBufferT<Js::LiteralString,false>(pcVar14,cchUseLength,scriptContext);
  return pJVar9;
}

Assistant:

JavascriptString* JavascriptString::ToCaseCore(JavascriptString* pThis)
    {
        using namespace PlatformAgnostic::UnicodeText;
        if (pThis->GetLength() == 0)
        {
            return pThis;
        }

        ScriptContext* scriptContext = pThis->type->GetScriptContext();
        ApiError error = ApiError::NoError;
        charcount_t pThisLength = pThis->GetLength();

        if (useInvariant)
        {
            const char16 *pThisString = pThis->GetString();
            bool isAscii = true;
            for (charcount_t i = 0; i < pThisLength; i++)
            {
                if (pThisString[i] >= 0x80)
                {
                    isAscii = false;
                    break;
                }
            }

            if (isAscii)
            {
                char16 *ret = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, UInt32Math::Add(pThisLength, 1));
                const char16 diffBetweenCases = 32;
                for (charcount_t i = 0; i < pThisLength; i++)
                {
                    char16 cur = pThisString[i];
                    if (toUpper)
                    {
                        if (cur >= _u('a') && cur <= _u('z'))
                        {
                            ret[i] = cur - diffBetweenCases;
                        }
                        else
                        {
                            ret[i] = cur;
                        }
                    }
                    else
                    {
                        if (cur >= _u('A') && cur <= _u('Z'))
                        {
                            ret[i] = cur + diffBetweenCases;
                        }
                        else
                        {
                            ret[i] = cur;
                        }
                    }
                }

                ret[pThisLength] = 0;

                return JavascriptString::NewWithBuffer(ret, pThisLength, scriptContext);
            }
        }

        // pre-flight to get the length required, as it may be longer than the original string
        // ICU and Win32(/POSIX) implementations of these functions differ slightly in how to get the required number of characters.
        // For Win32 (LCMapStringEx), you must provide nullptr/0, as providing a buffer that is too small will cause an error and will *not*
        // report the number of characters required. For ICU, however, you can provide a buffer that is too short, and it will still return
        // the length it actually needs.
        //
        // This is a small performance optimization because to(Upper|Lower)Case is can show up hot in certain scenarios.
        // ICU still allows nullptr/0 to be passed to get the string length, and more conservative callers of ChangeStringLinguisticCase should do just that.
        // TODO(jahorto): A truly PlatformAgnostic API wouldn't require cases like this. Once PlatformAgnostic is allowed to use
        // Chakra's memory subsystems, this API should be converted to one that only takes a source string and returns a Recycler-allocated
        // string in the correct case, performed using whatever operation is the fastest available on that platform.
#ifdef INTL_ICU
        charcount_t guessBufferLength = UInt32Math::Add(pThisLength, 1);
        char16 *guessBuffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, guessBufferLength);
#else
        charcount_t guessBufferLength = 0;
        char16 *guessBuffer = nullptr;
#endif

        charcount_t requiredStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), guessBuffer, guessBufferLength, &error);
        if (error == ApiError::OutOfMemory)
        {
            Throw::OutOfMemory();
        }

        // We exit ToCaseCore early if the source string is 0-length, and casing a non-zero length string should
        // never result in a zero-length string.
        AssertOrFailFast(requiredStringLength > 0 && IsValidCharCount(requiredStringLength));

#ifdef INTL_ICU
        if (error == ApiError::NoError)
        {
            if (requiredStringLength == 1)
            {
                // don't create a new string in case we may have cached this string earlier
                return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(guessBuffer[0]);
            }
            else
            {
                // use requiredStringLength instead of guessBufferLength because the string can get shorter
                return JavascriptString::NewWithBuffer(guessBuffer, requiredStringLength, scriptContext);
            }
        }
        AssertOrFailFast(error == ApiError::InsufficientBuffer);
#else
        AssertOrFailFast(error == ApiError::NoError);
        if (requiredStringLength == 1)
        {
            // this one-char string special case is only for non-ICU because there should never be a case where the error
            // was InsufficientBufer but the required length was 1
            char16 buffer[2] = { pThis->GetSz()[0], 0 };
            charcount_t actualStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), buffer, 2, &error);
            AssertOrFailFast(actualStringLength == 1 && error == ApiError::NoError);
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(buffer[0]);
        }
#endif

        AssertOrFailFast(requiredStringLength > 1);

        charcount_t bufferLength = UInt32Math::Add(requiredStringLength, 1);
        char16* buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, bufferLength);
        charcount_t actualStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), buffer, bufferLength, &error);
        AssertOrFailFast(actualStringLength == requiredStringLength && error == ApiError::NoError);
        return JavascriptString::NewWithBuffer(buffer, actualStringLength, scriptContext);
    }